

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O3

void license::LicenseGenerator::printHelp(char *prog_name,options_description *options)

{
  size_t sVar1;
  ostream *poVar2;
  long *plVar3;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  if (prog_name == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x6464c0);
  }
  else {
    sVar1 = strlen(prog_name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,prog_name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Version ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1.1.0",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,". Usage:",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (prog_name == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x6464c0);
  }
  else {
    sVar1 = strlen(prog_name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,prog_name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," [options] product_name1 product_name2 ... ",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             " product_name1 ... = Product name. This string must match the one passed by the software."
             ,0x59);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  plVar3 = (long *)boost::program_options::operator<<((ostream *)&std::cout,options);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void LicenseGenerator::printHelp(const char* prog_name,
		const po::options_description& options) {
	cout << endl;
	cout << prog_name << " Version " << PROJECT_VERSION << endl << ". Usage:"
			<< endl;
	cout << prog_name << " [options] product_name1 product_name2 ... " << endl
			<< endl;
	cout
			<< " product_name1 ... = Product name. This string must match the one passed by the software."
			<< endl;
	cout << options << endl;
}